

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseEnd
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  pointer ppTVar1;
  char *pcVar2;
  ulong uVar3;
  String SVar4;
  String counts;
  void *local_40 [2];
  TimeInMillis local_30;
  void *local_28 [2];
  
  if (FLAGS_gtest_print_time == '\x01') {
    String::operator=(&this->test_case_name_,(test_case->name_).c_str_);
    uVar3 = 0;
    for (ppTVar1 = (test_case->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppTVar1 !=
        (test_case->test_info_list_).
        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppTVar1 = ppTVar1 + 1) {
      uVar3 = (ulong)((int)uVar3 + (uint)(*ppTVar1)->should_run_);
    }
    pcVar2 = "tests";
    if ((int)uVar3 == 1) {
      pcVar2 = "test";
    }
    SVar4 = String::Format((char *)local_28,"%d %s",uVar3,pcVar2);
    ColoredPrintf(COLOR_GREEN,"[----------] ",SVar4.length_);
    pcVar2 = (this->test_case_name_).c_str_;
    local_30 = test_case->elapsed_time_;
    StreamableToString<long_long>((internal *)local_40,&local_30);
    printf("%s from %s (%s ms total)\n\n",local_28[0],pcVar2,local_40[0]);
    if (local_40[0] != (void *)0x0) {
      operator_delete__(local_40[0]);
    }
    fflush(_stdout);
    if (local_28[0] != (void *)0x0) {
      operator_delete__(local_28[0]);
    }
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseEnd(const TestCase& test_case) {
  if (!GTEST_FLAG(print_time)) return;

  test_case_name_ = test_case.name();
  const internal::String counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s (%s ms total)\n\n",
         counts.c_str(), test_case_name_.c_str(),
         internal::StreamableToString(test_case.elapsed_time()).c_str());
  fflush(stdout);
}